

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_sequencetask.cc
# Opt level: O2

void SequenceSpanTask::initialize(search *sch,size_t *num_actions,options_i *options)

{
  v_array<unsigned_int> *this;
  int *piVar1;
  option_group_definition *this_00;
  typed_option<unsigned_long> *op;
  ostream *poVar2;
  bool search_span_bilou;
  allocator local_254;
  allocator local_253;
  allocator local_252;
  allocator local_251;
  search *local_250;
  string local_248 [32];
  string local_228;
  string local_208 [32];
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [160];
  option_group_definition new_options;
  typed_option<unsigned_long> local_d0;
  
  local_250 = sch;
  piVar1 = (int *)operator_new(0x50);
  piVar1[0] = 0;
  piVar1[1] = 0;
  piVar1[2] = 0;
  piVar1[3] = 0;
  piVar1[4] = 0;
  piVar1[5] = 0;
  piVar1[6] = 0;
  piVar1[7] = 0;
  piVar1[8] = 0;
  piVar1[9] = 0;
  piVar1[10] = 0;
  piVar1[0xb] = 0;
  piVar1[0xc] = 0;
  piVar1[0xd] = 0;
  piVar1[0xe] = 0;
  piVar1[0xf] = 0;
  piVar1[0x10] = 0;
  piVar1[0x11] = 0;
  piVar1[0x12] = 0;
  piVar1[0x13] = 0;
  search_span_bilou = false;
  std::__cxx11::string::string
            ((string *)&local_1c8,"search sequencespan options",(allocator *)local_1a8);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::string((string *)&local_1e8,"search_span_bilou",&local_251);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_1a8,&local_1e8,&search_span_bilou);
  std::__cxx11::string::string
            (local_208,"switch to (internal) BILOU encoding instead of BIO encoding",&local_252);
  std::__cxx11::string::_M_assign((string *)(local_1a8 + 0x30));
  this_00 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                      (&new_options,(typed_option<bool> *)local_1a8);
  std::__cxx11::string::string((string *)&local_228,"search_span_multipass",&local_253);
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_d0,&local_228,(unsigned_long *)(piVar1 + 0x12));
  op = VW::config::typed_option<unsigned_long>::default_value(&local_d0,1);
  std::__cxx11::string::string(local_248,"do multiple passes",&local_254);
  std::__cxx11::string::_M_assign((string *)&(op->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>(this_00,op);
  std::__cxx11::string::~string(local_248);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_d0);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string(local_208);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_1a8);
  std::__cxx11::string::~string((string *)&local_1e8);
  (**options->_vptr_options_i)(options,&new_options);
  if (search_span_bilou == true) {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "switching to BILOU encoding for sequence span labeling");
    std::endl<char,std::char_traits<char>>(poVar2);
    *piVar1 = 1;
    *num_actions = *num_actions * 2 - 1;
  }
  else {
    *piVar1 = 0;
  }
  this = (v_array<unsigned_int> *)(piVar1 + 2);
  v_array<unsigned_int>::clear(this);
  if (*piVar1 == 1) {
    local_1a8._0_4_ = 1;
    v_array<unsigned_int>::push_back(this,(uint *)local_1a8);
    for (local_1a8._0_4_ = 2; (ulong)(uint)local_1a8._0_4_ < *num_actions;
        local_1a8._0_4_ = local_1a8._0_4_ + 4) {
      v_array<unsigned_int>::push_back(this,(uint *)local_1a8);
      local_d0.super_base_option._vptr_base_option._0_4_ = local_1a8._0_4_ + 1;
      v_array<unsigned_int>::push_back(this,(uint *)&local_d0);
    }
    local_1a8._0_4_ = 0;
    v_array<unsigned_int>::push_back((v_array<unsigned_int> *)(piVar1 + 10),(uint *)local_1a8);
    local_1a8._0_4_ = 0;
    v_array<unsigned_int>::push_back((v_array<unsigned_int> *)(piVar1 + 10),(uint *)local_1a8);
  }
  else if (*piVar1 == 0) {
    local_1a8._0_4_ = 1;
    v_array<unsigned_int>::push_back(this,(uint *)local_1a8);
    for (local_1a8._0_4_ = 2; (ulong)(uint)local_1a8._0_4_ < *num_actions;
        local_1a8._0_4_ = local_1a8._0_4_ + 2) {
      v_array<unsigned_int>::push_back(this,(uint *)local_1a8);
    }
    local_1a8._0_4_ = 1;
    v_array<unsigned_int>::push_back(this,(uint *)local_1a8);
  }
  local_250->task_data = piVar1;
  Search::search::set_options
            (local_250,
             Search::AUTO_HAMMING_LOSS | Search::AUTO_CONDITION_FEATURES |
             Search::EXAMPLES_DONT_CHANGE);
  Search::search::set_num_learners(local_250,*(size_t *)(piVar1 + 0x12));
  VW::config::option_group_definition::~option_group_definition(&new_options);
  return;
}

Assistant:

void initialize(Search::search& sch, size_t& num_actions, options_i& options)
{
  task_data* D = new task_data();

  bool search_span_bilou = false;
  option_group_definition new_options("search sequencespan options");
  new_options
      .add(make_option("search_span_bilou", search_span_bilou)
               .help("switch to (internal) BILOU encoding instead of BIO encoding"))
      .add(make_option("search_span_multipass", D->multipass).default_value(1).help("do multiple passes"));
  options.add_and_parse(new_options);

  if (search_span_bilou)
  {
    cerr << "switching to BILOU encoding for sequence span labeling" << endl;
    D->encoding = BILOU;
    num_actions = num_actions * 2 - 1;
  }
  else
    D->encoding = BIO;

  D->allowed_actions.clear();

  if (D->encoding == BIO)
  {
    D->allowed_actions.push_back(1);
    for (action l = 2; l < num_actions; l += 2) D->allowed_actions.push_back(l);
    D->allowed_actions.push_back(1);  // push back an extra 1 that we can overwrite later if we want
  }
  else if (D->encoding == BILOU)
  {
    D->allowed_actions.push_back(1);
    for (action l = 2; l < num_actions; l += 4)
    {
      D->allowed_actions.push_back(l);
      D->allowed_actions.push_back(l + 1);
    }
    D->only_two_allowed.push_back(0);
    D->only_two_allowed.push_back(0);
  }

  sch.set_task_data<task_data>(D);
  sch.set_options(Search::AUTO_CONDITION_FEATURES |  // automatically add history features to our examples, please
      Search::AUTO_HAMMING_LOSS |     // please just use hamming loss on individual predictions -- we won't declare loss
      Search::EXAMPLES_DONT_CHANGE |  // we don't do any internal example munging
      0);
  sch.set_num_learners(D->multipass);
}